

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutExperimental.hpp
# Opt level: O2

void __thiscall LayoutExperimental::~LayoutExperimental(LayoutExperimental *this)

{
  ~LayoutExperimental(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

virtual const char* name() const override { return "experimental"; }